

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::WarningsOptionParser::parseIntoConfig
          (WarningsOptionParser *this,Command *cmd,ConfigData *config)

{
  bool bVar1;
  ulong i;
  string local_70;
  string local_50;
  
  i = 0;
  while( true ) {
    if ((ulong)((long)(cmd->m_args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(cmd->m_args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= i) {
      return;
    }
    Command::operator[][abi_cxx11_(&local_70,cmd,i);
    bVar1 = std::operator==(&local_70,"NoAssertions");
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar1) break;
    *(undefined1 *)&config->warnings = (char)config->warnings | NoAssertions;
    i = i + 1;
  }
  Command::operator[][abi_cxx11_(&local_50,cmd,i);
  std::operator+(&local_70,"Unrecognised warning: ",&local_50);
  Command::raiseError(cmd,&local_70);
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( cmd[i] == "NoAssertions" )
                        config.warnings = (ConfigData::WarnAbout::What)( config.warnings | ConfigData::WarnAbout::NoAssertions );
                    else
                        cmd.raiseError( "Unrecognised warning: " + cmd[i] );
                }
            }